

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O3

void google::protobuf::internal::SwapFieldHelper::SwapInlinedStrings<false>
               (Reflection *r,Message *lhs,Message *rhs,FieldDescriptor *field)

{
  ReflectionSchema *this;
  ulong uVar1;
  byte bVar2;
  MessageLite *pMVar3;
  undefined1 *puVar4;
  bool donated;
  uint32_t uVar5;
  uint32_t uVar6;
  undefined4 extraout_var;
  LogMessage *pLVar7;
  Arena *pAVar8;
  FieldDescriptor *field_00;
  string *this_00;
  string temp;
  LogFinisher local_bd;
  uint32_t local_bc;
  ConstStringParam local_b8;
  FieldDescriptor *local_b0;
  Arena *local_a8;
  Message *local_a0;
  uint32_t local_94;
  ulong local_90;
  undefined1 *local_88;
  size_t local_80;
  undefined1 local_78 [16];
  LogMessage local_68;
  
  uVar1 = (lhs->super_MessageLite)._internal_metadata_.ptr_;
  local_a8 = (Arena *)(uVar1 & 0xfffffffffffffffc);
  if ((uVar1 & 1) != 0) {
    local_a8 = *(Arena **)local_a8;
  }
  uVar1 = (rhs->super_MessageLite)._internal_metadata_.ptr_;
  pAVar8 = (Arena *)(uVar1 & 0xfffffffffffffffc);
  if ((uVar1 & 1) != 0) {
    pAVar8 = *(Arena **)pAVar8;
  }
  this = &r->schema_;
  local_a0 = rhs;
  uVar5 = ReflectionSchema::GetFieldOffset(this,field);
  uVar6 = ReflectionSchema::GetFieldOffset(this,field);
  local_b8 = (ConstStringParam)CONCAT44(local_b8._4_4_,uVar6);
  uVar6 = ReflectionSchema::InlinedStringIndex(this,field);
  local_90 = CONCAT44(extraout_var,uVar6);
  if ((r->schema_).has_bits_offset_ == -1) {
    local_bc = uVar5;
    LogMessage::LogMessage
              (&local_68,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/generated_message_reflection.cc"
               ,0x99d);
    pLVar7 = LogMessage::operator<<(&local_68,"CHECK failed: schema_.HasHasbits(): ");
    LogFinisher::operator=((LogFinisher *)&local_88,pLVar7);
    LogMessage::~LogMessage(&local_68);
    uVar5 = local_bc;
  }
  local_94 = ReflectionSchema::InlinedStringDonatedOffset(this);
  local_b0 = field;
  if ((r->schema_).has_bits_offset_ == -1) {
    local_bc = uVar5;
    LogMessage::LogMessage
              (&local_68,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/generated_message_reflection.cc"
               ,0x99d);
    pLVar7 = LogMessage::operator<<(&local_68,"CHECK failed: schema_.HasHasbits(): ");
    LogFinisher::operator=((LogFinisher *)&local_88,pLVar7);
    uVar5 = local_bc;
    LogMessage::~LogMessage(&local_68);
  }
  this_00 = (string *)((long)&(lhs->super_MessageLite)._vptr_MessageLite + (ulong)uVar5);
  local_b8 = (ConstStringParam)
             ((long)&(local_a0->super_MessageLite)._vptr_MessageLite +
             ((ulong)local_b8 & 0xffffffff));
  ReflectionSchema::InlinedStringDonatedOffset(this);
  bVar2 = (byte)local_90 & 0x1f;
  if (local_a8 == pAVar8) {
    field_00 = local_b0;
    if ((r->schema_).inlined_string_donated_offset_ == -1) {
      LogMessage::LogMessage
                (&local_68,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/generated_message_reflection.cc"
                 ,0x997);
      pLVar7 = LogMessage::operator<<(&local_68,"CHECK failed: schema_.HasInlinedString(): ");
      field_00 = local_b0;
      LogFinisher::operator=((LogFinisher *)&local_88,pLVar7);
      LogMessage::~LogMessage(&local_68);
    }
    uVar5 = ReflectionSchema::InlinedStringDonatedOffset(this);
    uVar6 = ReflectionSchema::InlinedStringIndex(this,field_00);
    anon_unknown_0::IsIndexInHasBitSet
              ((uint32_t *)((long)&(lhs->super_MessageLite)._vptr_MessageLite + (ulong)uVar5),uVar6)
    ;
    if ((r->schema_).inlined_string_donated_offset_ == -1) {
      LogMessage::LogMessage
                (&local_68,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/generated_message_reflection.cc"
                 ,0x997);
      pLVar7 = LogMessage::operator<<(&local_68,"CHECK failed: schema_.HasInlinedString(): ");
      LogFinisher::operator=((LogFinisher *)&local_88,pLVar7);
      LogMessage::~LogMessage(&local_68);
    }
    uVar5 = ReflectionSchema::InlinedStringDonatedOffset(this);
    pMVar3 = &local_a0->super_MessageLite;
    uVar6 = ReflectionSchema::InlinedStringIndex(this,field_00);
    anon_unknown_0::IsIndexInHasBitSet
              ((uint32_t *)((long)&pMVar3->_vptr_MessageLite + (ulong)uVar5),uVar6);
    std::__cxx11::string::swap(this_00);
  }
  else {
    local_88 = local_78;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_88,*(long *)this_00,*(long *)(this_00 + 8) + *(long *)this_00);
    if ((r->schema_).inlined_string_donated_offset_ == -1) {
      LogMessage::LogMessage
                (&local_68,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/generated_message_reflection.cc"
                 ,0x997);
      pLVar7 = LogMessage::operator<<(&local_68,"CHECK failed: schema_.HasInlinedString(): ");
      LogFinisher::operator=(&local_bd,pLVar7);
      LogMessage::~LogMessage(&local_68);
    }
    uVar5 = ReflectionSchema::InlinedStringDonatedOffset(this);
    uVar6 = ReflectionSchema::InlinedStringIndex(this,local_b0);
    donated = anon_unknown_0::IsIndexInHasBitSet
                        ((uint32_t *)
                         ((long)&(lhs->super_MessageLite)._vptr_MessageLite + (ulong)uVar5),uVar6);
    InlinedStringField::Set
              ((InlinedStringField *)this_00,(string *)0x0,local_b8,local_a8,donated,
               (uint32_t *)
               ((long)&(lhs->super_MessageLite)._vptr_MessageLite +
               (local_90 >> 5 & 0x7ffffff) * 4 + (ulong)local_94),
               -2 << bVar2 | 0xfffffffeU >> 0x20 - bVar2);
    if ((r->schema_).inlined_string_donated_offset_ == -1) {
      LogMessage::LogMessage
                (&local_68,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/generated_message_reflection.cc"
                 ,0x997);
      pLVar7 = LogMessage::operator<<(&local_68,"CHECK failed: schema_.HasInlinedString(): ");
      LogFinisher::operator=(&local_bd,pLVar7);
      LogMessage::~LogMessage(&local_68);
    }
    uVar5 = ReflectionSchema::InlinedStringDonatedOffset(this);
    uVar6 = ReflectionSchema::InlinedStringIndex(this,local_b0);
    anon_unknown_0::IsIndexInHasBitSet
              ((uint32_t *)((long)&(local_a0->super_MessageLite)._vptr_MessageLite + (ulong)uVar5),
               uVar6);
    puVar4 = local_88;
    if ((long)local_80 < 0) {
      stringpiece_internal::StringPiece::LogFatalSizeTooBig
                (local_80,"string length exceeds max size");
    }
    std::__cxx11::string::_M_replace
              ((ulong)local_b8,0,(char *)local_b8->_M_string_length,(ulong)puVar4);
    if (local_88 != local_78) {
      operator_delete(local_88);
    }
  }
  return;
}

Assistant:

void SwapFieldHelper::SwapInlinedStrings(const Reflection* r, Message* lhs,
                                         Message* rhs,
                                         const FieldDescriptor* field) {
  // Inlined string field.
  Arena* lhs_arena = lhs->GetArenaForAllocation();
  Arena* rhs_arena = rhs->GetArenaForAllocation();
  auto* lhs_string = r->MutableRaw<InlinedStringField>(lhs, field);
  auto* rhs_string = r->MutableRaw<InlinedStringField>(rhs, field);
  const uint32 index = r->schema_.InlinedStringIndex(field);
  uint32* lhs_state = &r->MutableInlinedStringDonatedArray(lhs)[index / 32];
  uint32* rhs_state = &r->MutableInlinedStringDonatedArray(rhs)[index / 32];
  const uint32 mask = ~(static_cast<uint32>(1) << (index % 32));
  if (unsafe_shallow_swap || lhs_arena == rhs_arena) {
    lhs_string->Swap(rhs_string, /*default_value=*/nullptr, lhs_arena,
                     r->IsInlinedStringDonated(*lhs, field),
                     r->IsInlinedStringDonated(*rhs, field),
                     /*donating_states=*/lhs_state, rhs_state, mask);
  } else {
    const std::string temp = lhs_string->Get();
    lhs_string->Set(nullptr, rhs_string->Get(), lhs_arena,
                    r->IsInlinedStringDonated(*lhs, field), lhs_state, mask);
    rhs_string->Set(nullptr, temp, rhs_arena,
                    r->IsInlinedStringDonated(*rhs, field), rhs_state, mask);
  }
}